

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::updateStandaloneQualifierDefaults
          (HlslParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  TLayoutGeometry TVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 extraout_var;
  TConstUnionArray *this_00;
  TConstUnion *this_01;
  undefined4 extraout_var_00;
  long *plVar6;
  long lVar7;
  TQualifier *this_02;
  bool bVar8;
  TQualifier *qualifier;
  TVariable *workGroupSize_1;
  TVariable *workGroupSize;
  int max;
  int i;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((publicType->shaderQualifiers).vertices != -1) {
    bVar8 = true;
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
      bVar8 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry;
    }
    if (!bVar8) {
      __assert_fail("language == EShLangTessControl || language == EShLangGeometry",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x242c,
                    "void glslang::HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
  }
  if (((publicType->shaderQualifiers).invocations != -1) &&
     (bVar8 = TIntermediate::setInvocations
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (publicType->shaderQualifiers).invocations), !bVar8)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot change previously set layout value","invocations","");
  }
  if ((publicType->shaderQualifiers).geometry != ElgNone) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TVar1 = (publicType->shaderQualifiers).geometry;
      if (((2 < TVar1 - ElgPoints) && (1 < TVar1 - ElgTriangles)) &&
         (TVar1 != ElgQuads && TVar1 != ElgIsolines)) {
        pcVar4 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot apply to input",pcVar4,"");
      }
    }
    else if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 4) {
      handleOutputGeometry(this,loc,&(publicType->shaderQualifiers).geometry);
    }
    else {
      pcVar4 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
      pcVar5 = GetStorageQualifierString
                         ((TStorageQualifier)*(undefined8 *)&(publicType->qualifier).field_0x8 &
                          0x7f);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot apply to:",pcVar4,pcVar5);
    }
  }
  if ((publicType->shaderQualifiers).spacing != EvsNone) {
    TIntermediate::setVertexSpacing
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
               (publicType->shaderQualifiers).spacing);
  }
  if ((publicType->shaderQualifiers).order != EvoNone) {
    TIntermediate::setVertexOrder
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
               (publicType->shaderQualifiers).order);
  }
  if (((publicType->shaderQualifiers).pointMode & 1U) != 0) {
    TIntermediate::setPointMode((this->super_TParseContextBase).super_TParseVersions.intermediate);
  }
  for (workGroupSize._4_4_ = 0; workGroupSize._4_4_ < 3;
      workGroupSize._4_4_ = workGroupSize._4_4_ + 1) {
    if (1 < (publicType->shaderQualifiers).localSize[workGroupSize._4_4_]) {
      workGroupSize._0_4_ = 0;
      if (workGroupSize._4_4_ == 0) {
        workGroupSize._0_4_ = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeX;
      }
      else if (workGroupSize._4_4_ == 1) {
        workGroupSize._0_4_ = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeY;
      }
      else if (workGroupSize._4_4_ == 2) {
        workGroupSize._0_4_ = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeZ;
      }
      uVar2 = TIntermediate::getLocalSize
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         workGroupSize._4_4_);
      if ((uint)workGroupSize < uVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too large; see gl_MaxComputeWorkGroupSize","local_size","");
      }
      iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      this_00 = (TConstUnionArray *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xc0))();
      this_01 = TConstUnionArray::operator[](this_00,(long)workGroupSize._4_4_);
      uVar2 = TIntermediate::getLocalSize
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         workGroupSize._4_4_);
      TConstUnion::setUConst(this_01,uVar2);
    }
    if ((publicType->shaderQualifiers).localSizeSpecId[workGroupSize._4_4_] != -1) {
      TIntermediate::setLocalSizeSpecId
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 workGroupSize._4_4_,
                 (publicType->shaderQualifiers).localSizeSpecId[workGroupSize._4_4_]);
      iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x68))();
      lVar7 = (**(code **)(*plVar6 + 0x50))();
      *(ulong *)(lVar7 + 8) = *(ulong *)(lVar7 + 8) & 0xfffffffeffffffff | 0x100000000;
    }
  }
  if (((publicType->shaderQualifiers).earlyFragmentTests & 1U) != 0) {
    TIntermediate::setEarlyFragmentTests
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  }
  this_02 = &publicType->qualifier;
  switch(*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) {
  case 3:
    break;
  case 4:
    bVar8 = TQualifier::hasStream(this_02);
    if (bVar8) {
      *(ulong *)&(this->globalOutputDefaults).field_0x1c =
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xff00000000000000;
    }
    bVar8 = TQualifier::hasXfbBuffer(this_02);
    if (bVar8) {
      *(ulong *)&(this->globalOutputDefaults).field_0x24 =
           *(ulong *)&(this->globalOutputDefaults).field_0x24 & 0xfffffffffffffff0 |
           (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
    }
    bVar8 = TQualifier::hasXfbBuffer(&this->globalOutputDefaults);
    if (((bVar8) && (bVar8 = TQualifier::hasXfbStride(this_02), bVar8)) &&
       (bVar8 = TIntermediate::setXfbBufferStride
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf,
                           (uint)(*(ulong *)&(publicType->qualifier).field_0x24 >> 4) & 0x3fff),
       !bVar8)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                 (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf));
    }
    break;
  case 5:
    bVar8 = TQualifier::hasMatrix(this_02);
    if (bVar8) {
      *(ulong *)&(this->globalUniformDefaults).field_0x8 =
           *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
           *(ulong *)&(publicType->qualifier).field_0x8 & 0xe000000000000000;
    }
    bVar8 = TQualifier::hasPacking(this_02);
    if (bVar8) {
      (this->globalUniformDefaults).field_0x10 =
           (this->globalUniformDefaults).field_0x10 & 0xf0 |
           (publicType->qualifier).field_0x10 & 0xf;
    }
    break;
  case 6:
    bVar8 = TQualifier::hasMatrix(this_02);
    if (bVar8) {
      *(ulong *)&(this->globalBufferDefaults).field_0x8 =
           *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
           *(ulong *)&(publicType->qualifier).field_0x8 & 0xe000000000000000;
    }
    bVar8 = TQualifier::hasPacking(this_02);
    if (bVar8) {
      (this->globalBufferDefaults).field_0x10 =
           (this->globalBufferDefaults).field_0x10 & 0xf0 | (publicType->qualifier).field_0x10 & 0xf
      ;
    }
    break;
  default:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "default qualifier requires \'uniform\', \'buffer\', \'in\', or \'out\' storage qualification"
               ,"");
  }
  return;
}

Assistant:

void HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry);
        // const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                      "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            handleOutputGeometry(loc, publicType.shaderQualifiers.geometry);
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                  GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone)
        intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing);
    if (publicType.shaderQualifiers.order != EvoNone)
        intermediate.setVertexOrder(publicType.shaderQualifiers.order);
    if (publicType.shaderQualifiers.pointMode)
        intermediate.setPointMode();
    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSize[i] > 1) {
            int max = 0;
            switch (i) {
            case 0: max = resources.maxComputeWorkGroupSizeX; break;
            case 1: max = resources.maxComputeWorkGroupSizeY; break;
            case 2: max = resources.maxComputeWorkGroupSizeZ; break;
            default: break;
            }
            if (intermediate.getLocalSize(i) > (unsigned int)max)
                error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");

            // Fix the existing constant gl_WorkGroupSize with this new information.
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]);
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }
    if (publicType.shaderQualifiers.earlyFragmentTests)
        intermediate.setEarlyFragmentTests();

    const TQualifier& qualifier = publicType.qualifier;

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d",
                      qualifier.layoutXfbBuffer);
        }
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', or 'out' storage qualification", "", "");
        return;
    }
}